

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O2

uint32_t Hacl_Bignum_Lib_bn_get_top_index_u32(uint32_t len,uint32_t *b)

{
  uint32_t uVar1;
  uint uVar2;
  undefined4 in_register_0000003c;
  uint32_t i;
  long lVar3;
  
  uVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
    uVar1 = FStar_UInt32_eq_mask(*(uint32_t *)(CONCAT44(in_register_0000003c,len) + lVar3 * 4),0);
    uVar2 = (uVar2 ^ (uint)lVar3) & uVar1 ^ (uint)lVar3;
  }
  return uVar2;
}

Assistant:

static inline uint32_t Hacl_Bignum_Lib_bn_get_top_index_u32(uint32_t len, uint32_t *b)
{
  uint32_t priv = 0U;
  for (uint32_t i = 0U; i < len; i++)
  {
    uint32_t mask = FStar_UInt32_eq_mask(b[i], 0U);
    priv = (mask & priv) | (~mask & i);
  }
  return priv;
}